

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall TPZMatrix<std::complex<double>_>::Simetrize(TPZMatrix<std::complex<double>_> *this)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  lVar6 = (this->super_TPZBaseMatrix).fRow;
  if (lVar6 != (this->super_TPZBaseMatrix).fCol) {
    Error("Simetrize only work for square matrices",(char *)0x0);
    lVar6 = (this->super_TPZBaseMatrix).fRow;
  }
  if (0 < lVar6) {
    lVar4 = 0;
    do {
      lVar5 = lVar4 + 1;
      for (lVar7 = lVar5; lVar7 < lVar6; lVar7 = lVar7 + 1) {
        iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                          (this,lVar4,lVar7);
        iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                          (this,lVar7,lVar4);
        uVar1 = ((undefined8 *)CONCAT44(extraout_var,iVar2))[1];
        *(undefined8 *)CONCAT44(extraout_var_00,iVar3) = *(undefined8 *)CONCAT44(extraout_var,iVar2)
        ;
        ((undefined8 *)CONCAT44(extraout_var_00,iVar3))[1] = uVar1;
      }
      lVar4 = lVar5;
    } while (lVar5 != lVar6);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Simetrize() {
  
  if ( Rows() != Cols() ) {
    Error( "Simetrize only work for square matrices" );
  }
  
  int64_t row,col;
  int64_t fDim1 = Rows();
  for(row=0; row<fDim1; row++) {
    for(col=row+1; col<fDim1; col++) {
      this->s(col,row) = this->s(row,col);
    }
  }
  
}